

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform * ON_Xform::DiagonalTransformation(ON_Xform *__return_storage_ptr__,ON_3dVector *diagnoal)

{
  ON_3dVector *diagnoal_local;
  
  DiagonalTransformation(__return_storage_ptr__,diagnoal->x,diagnoal->y,diagnoal->z);
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::DiagonalTransformation(
  const ON_3dVector& diagnoal
)
{
  return ON_Xform::DiagonalTransformation(diagnoal.x, diagnoal.y, diagnoal.z);
}